

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O3

double __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
::get_quadratic(BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *label_i,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *label_j)

{
  pointer pcVar1;
  double dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar1 = (label_i->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + label_i->_M_string_length);
  pcVar1 = (label_j->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + label_j->_M_string_length);
  dVar2 = _mat(this,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return dVar2;
}

Assistant:

FloatType get_quadratic( IndexType label_i, IndexType label_j ) const {
      return _mat( label_i, label_j );
    }